

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::ReadArray<unsigned_int>
          (CrateReader *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *d)

{
  StreamReader *pSVar1;
  uint64_t uVar2;
  bool bVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  size_t nbytes;
  size_t __n;
  int iVar7;
  char *pcVar8;
  uint64_t n;
  uint32_t _n;
  uint32_t shapesize;
  ostringstream ss_e;
  uint64_t local_1d0;
  uint local_1c4;
  long *local_1c0;
  long local_1b0 [2];
  uint32_t local_19c;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  if (d == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    return false;
  }
  local_1d0 = 0;
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar3 = StreamReader::read4(this->_sr,&local_19c);
    if (!bVar3) {
      ::std::__cxx11::ostringstream::ostringstream(local_198);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ReadArray",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
      iVar7 = 0x63a;
LAB_001dfd7d:
      poVar4 = (ostream *)::std::ostream::operator<<(local_198,iVar7);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pcVar8 = "Failed to read the number of array elements.";
      lVar6 = 0x2c;
      goto LAB_001e0085;
    }
    bVar3 = StreamReader::read4(this->_sr,&local_1c4);
    if (bVar3) {
      local_1d0 = (uint64_t)local_1c4;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_198);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ReadArray",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(local_198,0x63f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Failed to read the number of array elements.",0x2c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1c0);
      if (local_1c0 != local_1b0) {
        operator_delete(local_1c0,local_1b0[0] + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_198);
      ::std::ios_base::~ios_base(local_128);
    }
    if (!bVar3) {
      return false;
    }
  }
  else {
    bVar3 = StreamReader::read8(this->_sr,&local_1d0);
    if (!bVar3) {
      ::std::__cxx11::ostringstream::ostringstream(local_198);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ReadArray",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
      iVar7 = 0x644;
      goto LAB_001dfd7d;
    }
  }
  if ((this->_config).maxArrayElements < local_1d0) {
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ReadArray",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_198,0x64a);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar8 = "Too many array elements.";
    lVar6 = 0x18;
  }
  else {
    if (local_1d0 == 0) {
      return true;
    }
    uVar5 = local_1d0 * 4 + this->_memoryUsage;
    this->_memoryUsage = uVar5;
    if (uVar5 <= (this->_config).maxMemoryBudget) {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(d,local_1d0);
      pSVar1 = this->_sr;
      uVar2 = pSVar1->idx_;
      __n = pSVar1->length_ - uVar2;
      if (uVar2 + local_1d0 * 4 <= pSVar1->length_) {
        __n = local_1d0 << 2;
      }
      if (__n - 1 < local_1d0 << 2) {
        memcpy((d->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,pSVar1->binary_ + uVar2,__n);
        pSVar1->idx_ = pSVar1->idx_ + __n;
        return __n == 0;
      }
      return true;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ReadArray",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_198,0x651);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar8 = "Reached to max memory budget.";
    lVar6 = 0x1d;
  }
LAB_001e0085:
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar8,lVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1c0);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_198);
  ::std::ios_base::~ios_base(local_128);
  return false;
}

Assistant:

bool CrateReader::ReadArray(std::vector<T> *d) {

  if (!d) {
    return false;
  }

  uint64_t n{0};
  if (VERSION_LESS_THAN_0_8_0(_version)) {
    uint32_t shapesize; // not used
    if (!_sr->read4(&shapesize)) {
      PUSH_ERROR("Failed to read the number of array elements.");
      return false;
    }
    uint32_t _n;
    if (!_sr->read4(&_n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    n = _n;
  } else {
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  if (n == 0) {
    return true;
  }

  CHECK_MEMORY_USAGE(sizeof(T) * size_t(n));

  d->resize(size_t(n));
  if (_sr->read(sizeof(T) * n, sizeof(T) * size_t(n), reinterpret_cast<uint8_t *>(d->data()))) {
    return false;
  }

  return true;
}